

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O2

string * __thiscall
google::protobuf::internal::ArenaStringPtr::UnsafeMutablePointer_abi_cxx11_(ArenaStringPtr *this)

{
  void *pvVar1;
  string *psVar2;
  char *failure_msg;
  int line;
  LogMessageFatal LStack_18;
  
  pvVar1 = (this->tagged_ptr_).ptr_;
  if (((ulong)pvVar1 & 2) == 0) {
    failure_msg = "tagged_ptr_.IsMutable()";
    line = 0x210;
  }
  else {
    psVar2 = (string *)((ulong)pvVar1 & 0xfffffffffffffffc);
    if (psVar2 != (string *)0x0) {
      return psVar2;
    }
    failure_msg = "tagged_ptr_.Get() != nullptr";
    line = 0x211;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

uintptr_t as_int() const { return reinterpret_cast<uintptr_t>(ptr_); }